

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::TaskSet::destroyTasks(TaskSet *this)

{
  bool bVar1;
  Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> **ppOVar2;
  Fault local_58;
  Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> *local_50;
  Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> *_kj_result;
  OwnTask removed;
  Type local_28;
  undefined1 local_20 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:422:3)>
  _kjDefer429;
  TaskSet *this_local;
  
  local_28.this = this;
  _kjDefer429.maybeFunc.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:422:3)>_2
        )this;
  defer<kj::TaskSet::destroyTasks()::__0>((kj *)local_20,&local_28);
  while( true ) {
    bVar1 = Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_>::operator==(&this->tasks);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      kj::_::
      Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:422:3)>
      ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:422:3)>
                   *)local_20);
      return;
    }
    local_50 = kj::_::readMaybe<kj::TaskSet::Task,kj::_::PromiseDisposer>(&this->tasks);
    if (local_50 == (Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> *)0x0) break;
    ppOVar2 = mv<kj::Own<kj::TaskSet::Task,kj::_::PromiseDisposer>*>(&local_50);
    Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>::operator->(*ppOVar2);
    Task::pop((Task *)&_kj_result);
    Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>::~Own
              ((Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> *)&_kj_result);
  }
  kj::_::Debug::Fault::Fault
            (&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
             ,0x1b0,FAILED,"tasks != nullptr","");
  kj::_::Debug::Fault::fatal(&local_58);
}

Assistant:

void TaskSet::destroyTasks() {
  // You could argue it is dubious, but some applications would like for the destructor of a
  // task to be able to schedule new tasks. So when we cancel our tasks... we might find new
  // tasks added! We'll have to repeatedly cancel. Additionally, we need to make sure that we destroy
  // the items in a loop to prevent any issues with stack overflow.

  KJ_DEFER({
    // If an exception occurs, ensure the remaining tasks still get unlinked.  Here, we assume it
    // is not necessary to catch further exceptions, since we require destructors to guard against
    // exceptions when unwinding.
    while (tasks != kj::none) {
      auto removed = KJ_REQUIRE_NONNULL(tasks)->pop();
    }
  });

  while (tasks != kj::none) {
    auto removed = KJ_REQUIRE_NONNULL(tasks)->pop();
  }
}